

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O0

pcp_flow_t * pcp_get_flow(flow_key_data *fkd,pcp_server_t *s)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t pcp_server_index;
  uint32_t bucket;
  pcp_flow_t **fdb;
  pcp_server_t *s_local;
  flow_key_data *fkd_local;
  
  if (((fkd != (flow_key_data *)0x0) && (s != (pcp_server_t *)0x0)) && (s->ctx != (pcp_ctx_t *)0x0))
  {
    uVar1 = s->index;
    uVar2 = compute_flow_key(fkd);
    for (_pcp_server_index = (s->ctx->pcp_db).flows + uVar2; *_pcp_server_index != (pcp_flow_t *)0x0
        ; _pcp_server_index = &(*_pcp_server_index)->next) {
      if (((*_pcp_server_index)->pcp_server_indx == uVar1) &&
         (iVar3 = memcmp(fkd,&(*_pcp_server_index)->kd,0x4c), iVar3 == 0)) {
        return *_pcp_server_index;
      }
    }
  }
  return (pcp_flow_t *)0x0;
}

Assistant:

pcp_flow_t *pcp_get_flow(struct flow_key_data *fkd, pcp_server_t *s) {
    pcp_flow_t **fdb;
    uint32_t bucket;
    uint32_t pcp_server_index;

    if ((!fkd) || (!s) || (!s->ctx)) {
        return NULL;
    }
    pcp_server_index = s->index;

    bucket = compute_flow_key(fkd);
    PCP_LOG(PCP_LOGLVL_DEBUG, "Computed key_bucket %d", bucket);
    for (fdb = &s->ctx->pcp_db.flows[bucket]; (*fdb) != NULL;
         fdb = &(*fdb)->next) {
        if (((*fdb)->pcp_server_indx == pcp_server_index) &&
            (0 == memcmp(fkd, &(*fdb)->kd, sizeof(*fkd)))) {
            return *fdb;
        }
    }

    return NULL;
}